

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O2

void __thiscall llvm::detail::IEEEFloat::makeSmallest(IEEEFloat *this,bool Negative)

{
  uint uVar1;
  Significand *dst;
  
  this->field_0x12 = Negative << 3 | this->field_0x12 & 0xf0 | 2;
  this->exponent = this->semantics->minExponent;
  uVar1 = this->semantics->precision;
  if (uVar1 - 0x40 < 0xffffff80) {
    dst = (Significand *)(this->significand).parts;
  }
  else {
    dst = &this->significand;
  }
  APInt::tcSet(&dst->part,1,uVar1 + 0x40 >> 6);
  return;
}

Assistant:

void IEEEFloat::makeSmallest(bool Negative) {
  // We want (in interchange format):
  //   sign = {Negative}
  //   exponent = 0..0
  //   significand = 0..01
  category = fcNormal;
  sign = Negative;
  exponent = semantics->minExponent;
  APInt::tcSet(significandParts(), 1, partCount());
}